

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btAlignedObjectArray.h
# Opt level: O0

void __thiscall
btAlignedObjectArray<btMultiBodyLinkCollider_*>::~btAlignedObjectArray
          (btAlignedObjectArray<btMultiBodyLinkCollider_*> *this)

{
  clear(this);
  return;
}

Assistant:

~btAlignedObjectArray()
		{
			clear();
		}